

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall DLevelScript::CheckActorProperty(DLevelScript *this,int tid,int property,int value)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  AActor *this_00;
  BYTE *pBVar3;
  long lVar4;
  char *__s2;
  BYTE *__s1;
  bool bVar5;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  this_00 = (this->activator).field_0.p;
  if (this_00 == (AActor *)0x0) {
LAB_003be789:
    this_00 = (AActor *)0x0;
  }
  else if (((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->activator).field_0.p = (AActor *)0x0;
    goto LAB_003be789;
  }
  if (tid == 0) {
    if (this_00 == (AActor *)0x0) {
      return 0;
    }
  }
  else {
    this_00 = AActor::TIDHash[tid & 0x7f];
    while( true ) {
      if (this_00 == (AActor *)0x0) {
        return 0;
      }
      if (this_00->tid == tid) break;
      this_00 = this_00->inext;
    }
  }
  uVar1 = 0;
  switch(property) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 0xc:
  case 0xf:
  case 0x11:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x2d:
    iVar2 = GetActorProperty(this,tid,property);
    bVar5 = iVar2 == value;
    goto LAB_003be8bf;
  case 5:
    lVar4 = (long)(this_00->SeeSound).super_FSoundID.ID;
    break;
  case 6:
    lVar4 = (long)(this_00->AttackSound).super_FSoundID.ID;
    break;
  case 7:
    lVar4 = (long)(this_00->PainSound).super_FSoundID.ID;
    break;
  case 8:
    lVar4 = (long)(this_00->DeathSound).super_FSoundID.ID;
    break;
  case 9:
    lVar4 = (long)(this_00->ActiveSound).super_FSoundID.ID;
    break;
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x17:
  case 0x1f:
    uVar1 = GetActorProperty(this,tid,property);
    bVar5 = uVar1 == (value != 0);
    goto LAB_003be8bf;
  case 0x14:
    AActor::GetSpecies((AActor *)&stack0xffffffffffffffec);
    pBVar3 = (BYTE *)FName::NameData.NameArray[local_14].Text;
    goto LAB_003be89d;
  case 0x15:
    pBVar3 = (BYTE *)AActor::GetTag(this_00,(char *)0x0);
    goto LAB_003be89d;
  default:
    goto switchD_003be7d6_caseD_2a;
  case 0x2e:
    pBVar3 = (BYTE *)FName::NameData.NameArray[(this_00->DamageType).super_FName.Index].Text;
    goto LAB_003be89d;
  }
  if (lVar4 == 0) {
    pBVar3 = (BYTE *)0x0;
  }
  else {
    pBVar3 = (BYTE *)S_sfx.Array[lVar4].name.Chars;
  }
LAB_003be89d:
  __s1 = "";
  if (pBVar3 != (BYTE *)0x0) {
    __s1 = pBVar3;
  }
  __s2 = FBehavior::StaticLookupString(value);
  iVar2 = strcasecmp((char *)__s1,__s2);
  bVar5 = iVar2 == 0;
LAB_003be8bf:
  uVar1 = (uint)bVar5;
switchD_003be7d6_caseD_2a:
  return uVar1;
}

Assistant:

int DLevelScript::CheckActorProperty (int tid, int property, int value)
{
	AActor *actor = SingleActorFromTID (tid, activator);
	const char *string = NULL;
	if (actor == NULL)
	{
		return 0;
	}
	switch (property)
	{
		// Default
		default:				return 0;

		// Straightforward integer values:
		case APROP_Health:
		case APROP_Speed:
		case APROP_Damage:
		case APROP_DamageFactor:
		case APROP_Alpha:
		case APROP_RenderStyle:
		case APROP_Gravity:
		case APROP_SpawnHealth:
		case APROP_JumpZ:
		case APROP_Score:
		case APROP_MasterTID:
		case APROP_TargetTID:
		case APROP_TracerTID:
		case APROP_WaterLevel:
		case APROP_ScaleX:
		case APROP_ScaleY:
		case APROP_Mass:
		case APROP_Accuracy:
		case APROP_Stamina:
		case APROP_Height:
		case APROP_Radius:
		case APROP_ReactionTime:
		case APROP_MeleeRange:
		case APROP_ViewHeight:
		case APROP_AttackZOffset:
		case APROP_MaxStepHeight:
		case APROP_MaxDropOffHeight:
		case APROP_StencilColor:
			return (GetActorProperty(tid, property) == value);

		// Boolean values need to compare to a binary version of value
		case APROP_Ambush:
		case APROP_Invulnerable:
		case APROP_Dropped:
		case APROP_ChaseGoal:
		case APROP_Frightened:
		case APROP_Friendly:
		case APROP_Notarget:
		case APROP_Notrigger:
		case APROP_Dormant:
			return (GetActorProperty(tid, property) == (!!value));

		// Strings are covered by GetActorProperty, but they're fairly
		// heavy-duty, so make the check here.
		case APROP_SeeSound:	string = actor->SeeSound; break;
		case APROP_AttackSound:	string = actor->AttackSound; break;
		case APROP_PainSound:	string = actor->PainSound; break;
		case APROP_DeathSound:	string = actor->DeathSound; break;
		case APROP_ActiveSound:	string = actor->ActiveSound; break; 
		case APROP_Species:		string = actor->GetSpecies(); break;
		case APROP_NameTag:		string = actor->GetTag(); break;
		case APROP_DamageType:	string = actor->DamageType; break;
	}
	if (string == NULL) string = "";
	return (!stricmp(string, FBehavior::StaticLookupString(value)));
}